

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void selectDisplayConnection(timeval *timeout)

{
  int iVar1;
  uint __i;
  long lVar2;
  fd_set fds;
  
  iVar1 = *(int *)(_glfw.x11.display + 0x10);
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    fds.__fds_bits[lVar2] = 0;
  }
  fds.__fds_bits[iVar1 / 0x40] = fds.__fds_bits[iVar1 / 0x40] | 1L << ((byte)iVar1 & 0x3f);
  select(iVar1 + 1,(fd_set *)&fds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)timeout);
  return;
}

Assistant:

void selectDisplayConnection(struct timeval* timeout)
{
    fd_set fds;
    const int fd = ConnectionNumber(_glfw.x11.display);

    FD_ZERO(&fds);
    FD_SET(fd, &fds);

    // select(1) is used instead of an X function like XNextEvent, as the
    // wait inside those are guarded by the mutex protecting the display
    // struct, locking out other threads from using X (including GLX)
    select(fd + 1, &fds, NULL, NULL, timeout);
}